

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ImNodes.cpp
# Opt level: O2

bool ImNodes::IsConnectingCompatibleSlot(void)

{
  int iVar1;
  long lVar2;
  int iVar3;
  ImGuiPayload *pIVar4;
  _IgnoreSlot *p_Var5;
  int i;
  byte unaff_R12B;
  char drag_id [32];
  
  if (gCanvas == 0) {
    __assert_fail("gCanvas != nullptr",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/kidanger[P]vpe/ImNodes/ImNodes.cpp"
                  ,0x32f,"bool ImNodes::IsConnectingCompatibleSlot()");
  }
  lVar2 = *(long *)(gCanvas + 0x98);
  pIVar4 = ImGui::GetDragDropPayload();
  if ((pIVar4 != (ImGuiPayload *)0x0) && (unaff_R12B = 0, *pIVar4->Data != *(long *)(lVar2 + 0x10)))
  {
    snprintf(drag_id,0x20,"new-node-connection-%08X",(ulong)(uint)-*(int *)(lVar2 + 0x28));
    iVar3 = strcmp(drag_id,pIVar4->DataType);
    if (iVar3 == 0) {
      for (iVar3 = 0; iVar1 = ((ImVector<ImNodes::_IgnoreSlot> *)(lVar2 + 0x98))->Size,
          unaff_R12B = iVar1 <= iVar3, iVar3 < iVar1; iVar3 = iVar3 + 1) {
        p_Var5 = ImVector<ImNodes::_IgnoreSlot>::operator[]
                           ((ImVector<ImNodes::_IgnoreSlot> *)(lVar2 + 0x98),iVar3);
        if ((p_Var5->node_id == *(void **)(lVar2 + 0x10)) &&
           (-1 < (int)(*(uint *)(lVar2 + 0x28) ^ p_Var5->slot_kind))) break;
      }
    }
  }
  return (bool)(pIVar4 != (ImGuiPayload *)0x0 & unaff_R12B);
}

Assistant:

bool IsConnectingCompatibleSlot()
{
    assert(gCanvas != nullptr);
    auto* canvas = gCanvas;
    auto* impl = canvas->_impl;

    if (auto* payload = ImGui::GetDragDropPayload())
    {
        auto* drag_payload = (_DragConnectionPayload*)payload->Data;

        if (drag_payload->node_id == impl->node.id)
            // Node can not connect to itself
            return false;

        char drag_id[32];
        snprintf(drag_id, sizeof(drag_id), "new-node-connection-%08X", impl->slot.kind * -1);
        if (strcmp(drag_id, payload->DataType) != 0)
            return false;

        for (int i = 0; i < impl->ignore_connections.size(); i++)
        {
            const _IgnoreSlot& ignored = impl->ignore_connections[i];
            if (ignored.node_id == impl->node.id && strcmp(ignored.slot_name, ignored.slot_name) == 0 &&
                IsInputSlotKind(ignored.slot_kind) == IsInputSlotKind(impl->slot.kind))
                return false;
        }

        return true;
    }

    return false;
}